

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O1

void __thiscall cursespp::App::App(App *this,string *title)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  runtime_error *this_00;
  string *psVar3;
  string *value;
  string lcCType;
  string lang;
  string lcAll;
  string local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  string local_a8;
  WindowState *local_88;
  string *local_80;
  string *local_78;
  string local_70;
  string local_50;
  
  (this->injectedKeys).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->injectedKeys).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->injectedKeys).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->injectedKeys).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->injectedKeys).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->injectedKeys).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->injectedKeys).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->injectedKeys).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->injectedKeys).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->injectedKeys).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this,0);
  memset(&this->state,0,0xb0);
  this->colorMode = Palette;
  this->bgType = Theme;
  local_b0 = &(this->colorTheme).field_2;
  (this->colorTheme)._M_dataplus._M_p = (pointer)local_b0;
  (this->colorTheme)._M_string_length = 0;
  (this->colorTheme).field_2._M_local_buf[0] = '\0';
  psVar3 = &this->quitKey;
  local_b8 = &(this->quitKey).field_2;
  (this->quitKey)._M_dataplus._M_p = (pointer)local_b8;
  local_88 = &this->state;
  std::__cxx11::string::_M_construct<char_const*>((string *)psVar3,"^D","");
  this->mouseEnabled = true;
  this->quit = false;
  this->initialized = false;
  local_c0 = &(this->appTitle).field_2;
  (this->appTitle)._M_dataplus._M_p = (pointer)local_c0;
  (this->appTitle)._M_string_length = 0;
  (this->appTitle).field_2._M_local_buf[0] = '\0';
  local_80 = psVar3;
  if (instance == (App *)0x0) {
    local_e0.field_2._M_allocated_capacity._0_4_ = 0x415f434c;
    local_e0.field_2._M_allocated_capacity._4_2_ = 0x4c4c;
    local_e0._M_string_length = 6;
    local_e0.field_2._M_local_buf[6] = '\0';
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    getEnvironmentVariable(&local_50,&local_e0);
    local_78 = title;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,
                      CONCAT17(local_e0.field_2._M_local_buf[7],
                               CONCAT16(local_e0.field_2._M_local_buf[6],
                                        CONCAT24(local_e0.field_2._M_allocated_capacity._4_2_,
                                                 local_e0.field_2._M_allocated_capacity._0_4_))) + 1
                     );
    }
    paVar1 = &local_a8.field_2;
    local_a8.field_2._M_allocated_capacity = 0x45505954435f434c;
    local_a8._M_string_length = 8;
    local_a8.field_2._M_local_buf[8] = '\0';
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    getEnvironmentVariable(&local_e0,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    local_70.field_2._M_allocated_capacity._0_4_ = 0x474e414c;
    local_70._M_string_length = 4;
    local_70.field_2._M_allocated_capacity._4_4_ =
         local_70.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    getEnvironmentVariable(&local_a8,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT44(local_70.field_2._M_allocated_capacity._4_4_,
                               local_70.field_2._M_allocated_capacity._0_4_) + 1);
    }
    psVar3 = &local_e0;
    if (local_e0._M_string_length == 0) {
      psVar3 = &local_a8;
    }
    value = &local_50;
    if (local_50._M_string_length == 0) {
      value = psVar3;
    }
    bVar2 = containsUtf8(value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    psVar3 = local_78;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,
                      CONCAT17(local_e0.field_2._M_local_buf[7],
                               CONCAT16(local_e0.field_2._M_local_buf[6],
                                        CONCAT24(local_e0.field_2._M_allocated_capacity._4_2_,
                                                 local_e0.field_2._M_allocated_capacity._0_4_))) + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (!bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "\n\nThis application requires a UTF-8 compatible LANG environment variable to be set in the controlling terminal. Setting to C.UTF-8. Depending on your environment, you may see corrupted output. If that\'st he case, try to set LANG=C.UTF-8 before starting musikcube.\n\n\n\n"
                 ,0x10b);
      setenv("LANG","C.UTF-8",1);
    }
    instance = this;
    this->minWidth = 0;
    this->minHeight = 0;
    this->mouseEnabled = true;
    this->quit = false;
    setlocale(6,"");
    signal(1,hangupHandler);
    signal(0x1c,resizedHandler);
    signal(0xd,(__sighandler_t)0x1);
    this->colorMode = Palette;
    InitCurses(this);
    SetTitle(this,psVar3);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"app instance already running!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

App::App(const std::string& title) {
    if (instance) {
        throw std::runtime_error("app instance already running!");
    }

#ifndef WIN32
    if (!isLangUtf8()) {
        std::cout << "\n\nThis application requires a UTF-8 compatible LANG environment "
        "variable to be set in the controlling terminal. Setting to C.UTF-8. Depending on "
        "your environment, you may see corrupted output. If that'st he case, try to set "
        "LANG=C.UTF-8 before starting musikcube.\n\n\n\n";
        setenv("LANG", "C.UTF-8", 1);
    }
#endif

    instance = this; /* only one instance. */
    this->quit = false;
    this->minWidth = this->minHeight = 0;
    this->mouseEnabled = true;

#ifdef WIN32
    this->iconId = 0;
    this->colorMode = Colors::RGB;
    win32::ConfigureDpiAwareness();
#else
    setlocale(LC_ALL, "");
    std::signal(SIGHUP, hangupHandler);
    std::signal(SIGWINCH, resizedHandler);
    std::signal(SIGPIPE, SIG_IGN);
    this->colorMode = Colors::Palette;
#endif

    this->InitCurses();
    this->SetTitle(title);
}